

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_format_specs(format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *this,int id,char *begin,char *end)

{
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *this_00;
  size_t *psVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_format_specs<char> specs;
  basic_format_specs<char> specs_00;
  basic_format_specs<char> specs_01;
  basic_string_view<char> value_01;
  char *pcVar2;
  format_arg arg;
  unkbyte10 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  undefined1 local_98 [24];
  undefined2 uStack_80;
  undefined6 uStack_7e;
  type local_78;
  undefined1 local_68 [40];
  undefined8 local_40;
  char_spec_handler local_38;
  
  this_00 = &this->context;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((format_arg *)(local_98 + 0x10),(detail *)this_00,
             (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)(uint)id,
             (int)end);
  if (local_78 == custom_type) {
    pcVar2 = (this->parse_context).format_str_.data_;
    (this->parse_context).format_str_.data_ = begin;
    psVar1 = &(this->parse_context).format_str_.size_;
    *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)begin));
    (*(code *)CONCAT62(uStack_7e,uStack_80))
              (CONCAT44(local_98._20_4_,local_98._16_4_),&this->parse_context,this_00);
    pcVar2 = (this->parse_context).format_str_.data_;
  }
  else {
    local_98._0_8_ = (buffer<char> *)0xffffffff00000000;
    local_98[8] = '\0';
    local_98[9] = 0;
    local_98[10] = ' ';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\x01';
    pcVar2 = begin + 1;
    if (((pcVar2 < end) && (*pcVar2 == '}')) && ((byte)((*begin & 0xdfU) + 0xbf) < 0x1a)) {
      local_98._9_3_ = 0x2000;
      local_98[8] = *begin;
    }
    else {
      local_68._8_8_ = &this->parse_context;
      local_68._0_8_ = local_98;
      local_68._24_8_ = local_68;
      local_68._32_4_ = local_78;
      local_68._16_8_ = this_00;
      pcVar2 = parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                         (begin,end,
                          (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                           *)local_68._24_8_);
      if ((pcVar2 == end) || (*pcVar2 != '}')) {
        error_handler::on_error((error_handler *)this,"missing \'}\' in format string");
      }
    }
    local_68._32_8_ = &this->parse_context;
    local_68._0_8_ =
         (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    local_68._8_8_ = (this->context).loc_.locale_;
    local_68._16_8_ = local_98;
    local_40 = 0;
    local_68._24_8_ = this_00;
    switch(local_78) {
    case int_type:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<int>((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        *)local_68,local_98._16_4_,(format_specs *)local_98);
      break;
    case uint_type:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_int>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)local_68,local_98._16_4_,(format_specs *)local_98);
      break;
    case long_long_type:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<long_long>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)local_68,CONCAT44(local_98._20_4_,local_98._16_4_),(format_specs *)local_98);
      break;
    case ulong_long_type:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_long_long>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)local_68,CONCAT44(local_98._20_4_,local_98._16_4_),(format_specs *)local_98);
      break;
    case int128_type:
      value._10_6_ = in_stack_ffffffffffffff62;
      value._0_10_ = in_stack_ffffffffffffff58;
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<__int128>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)local_68,(__int128)value,
                 (format_specs *)CONCAT44(local_98._20_4_,local_98._16_4_));
      break;
    case uint128_type:
      value_00._10_6_ = in_stack_ffffffffffffff62;
      value_00._0_10_ = in_stack_ffffffffffffff58;
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
      ::write_int<unsigned__int128>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
                  *)local_68,(unsigned___int128)value_00,
                 (format_specs *)CONCAT44(local_98._20_4_,local_98._16_4_));
      break;
    case bool_type:
      local_68._0_8_ =
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         *)local_68,(bool)local_98[0x10]);
      break;
    case char_type:
      local_38.formatter =
           (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
            *)local_68;
      local_38.value = local_98[0x10];
      handle_char_specs<char,fmt::v7::detail::arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>::char_spec_handler>
                ((basic_format_specs<char> *)local_98,&local_38);
      break;
    case float_type:
      specs_01.type = local_98[8];
      specs_01._9_1_ = local_98[9];
      specs_01.fill.data_[0] = local_98[10];
      specs_01.fill.data_[1] = local_98[0xb];
      specs_01.width = local_98._0_4_;
      specs_01.precision = local_98._4_4_;
      specs_01.fill.data_[2] = local_98[0xc];
      specs_01.fill.data_[3] = local_98[0xd];
      specs_01.fill.size_ = local_98[0xe];
      specs_01._15_1_ = local_98[0xf];
      local_68._0_8_ =
           write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                     ((buffer_appender<char>)local_68._0_8_,(float)local_98._16_4_,specs_01,
                      (locale_ref)local_68._8_8_);
      break;
    case double_type:
      specs.type = local_98[8];
      specs._9_1_ = local_98[9];
      specs.fill.data_[0] = local_98[10];
      specs.fill.data_[1] = local_98[0xb];
      specs.width = local_98._0_4_;
      specs.precision = local_98._4_4_;
      specs.fill.data_[2] = local_98[0xc];
      specs.fill.data_[3] = local_98[0xd];
      specs.fill.size_ = local_98[0xe];
      specs._15_1_ = local_98[0xf];
      local_68._0_8_ =
           write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                     ((buffer_appender<char>)local_68._0_8_,
                      (double)CONCAT44(local_98._20_4_,local_98._16_4_),specs,
                      (locale_ref)local_68._8_8_);
      break;
    case last_numeric_type:
      specs_00.type = local_98[8];
      specs_00._9_1_ = local_98[9];
      specs_00.fill.data_[0] = local_98[10];
      specs_00.fill.data_[1] = local_98[0xb];
      specs_00.width = local_98._0_4_;
      specs_00.precision = local_98._4_4_;
      specs_00.fill.data_[2] = local_98[0xc];
      specs_00.fill.data_[3] = local_98[0xd];
      specs_00.fill.size_ = local_98[0xe];
      specs_00._15_1_ = local_98[0xf];
      local_68._0_8_ =
           write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                     ((buffer_appender<char>)local_68._0_8_,
                      (longdouble)CONCAT28(uStack_80,CONCAT44(local_98._20_4_,local_98._16_4_)),
                      specs_00,(locale_ref)local_68._8_8_);
      break;
    case cstring_type:
      local_68._0_8_ =
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         *)local_68,(char *)CONCAT44(local_98._20_4_,local_98._16_4_));
      break;
    case string_type:
      value_01.data_._4_4_ = local_98._20_4_;
      value_01.data_._0_4_ = local_98._16_4_;
      value_01.size_._0_2_ = uStack_80;
      value_01.size_._2_6_ = uStack_7e;
      local_68._0_8_ =
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         *)local_68,value_01);
      break;
    case pointer_type:
      local_68._0_8_ =
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         *)local_68,(void *)CONCAT44(local_98._20_4_,local_98._16_4_));
      break;
    case custom_type:
      (*(code *)CONCAT62(uStack_7e,uStack_80))
                (CONCAT44(local_98._20_4_,local_98._16_4_),local_68._32_8_,this_00);
      local_68._0_8_ =
           ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)
           &((specs_setter<char> *)local_68._24_8_)->specs_)->container;
    }
    (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)local_68._0_8_;
  }
  return pcVar2;
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    auto arg = get_arg(context, id);
    if (arg.type() == type::custom_type) {
      advance_to(parse_context, begin);
      visit_format_arg(custom_formatter<Context>(parse_context, context), arg);
      return parse_context.begin();
    }
    auto specs = basic_format_specs<Char>();
    if (begin + 1 < end && begin[1] == '}' && is_ascii_letter(*begin)) {
      specs.type = static_cast<char>(*begin++);
    } else {
      using parse_context_t = basic_format_parse_context<Char>;
      specs_checker<specs_handler<parse_context_t, Context>> handler(
          specs_handler<parse_context_t, Context>(specs, parse_context,
                                                  context),
          arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
    }
    context.advance_to(visit_format_arg(
        arg_formatter<OutputIt, Char>(context, &parse_context, &specs), arg));
    return begin;
  }